

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.c
# Opt level: O2

_Bool CheckCollisionPointLine(Vector2 point,Vector2 p1,Vector2 p2,int threshold)

{
  byte bVar1;
  byte bVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  
  fVar8 = p2.x;
  fVar10 = p2.y;
  fVar6 = p1.x;
  fVar7 = p1.y;
  fVar3 = point.x;
  fVar5 = point.y;
  fVar11 = fVar8 - fVar6;
  fVar9 = fVar10 - fVar7;
  fVar4 = fmaxf(ABS(fVar11),ABS(fVar9));
  if (fVar4 * (float)threshold <= ABS((fVar3 - fVar6) * fVar9 - (fVar5 - fVar7) * fVar11)) {
    bVar2 = 0;
  }
  else {
    if (ABS(fVar9) <= ABS(fVar11)) {
      if (fVar11 <= 0.0) {
        bVar1 = -(fVar8 <= fVar3);
        bVar2 = -(fVar3 <= fVar6);
      }
      else {
        bVar1 = -(fVar6 <= fVar3);
        bVar2 = -(fVar3 <= fVar8);
      }
    }
    else if (fVar9 <= 0.0) {
      bVar1 = -(fVar10 <= fVar5);
      bVar2 = -(fVar5 <= fVar7);
    }
    else {
      bVar1 = -(fVar7 <= fVar5);
      bVar2 = -(fVar5 <= fVar10);
    }
    bVar2 = bVar2 & bVar1;
  }
  return (_Bool)(bVar2 & 1);
}

Assistant:

bool CheckCollisionPointLine(Vector2 point, Vector2 p1, Vector2 p2, int threshold)
{
    bool collision = false;
    float dxc = point.x - p1.x;
    float dyc = point.y - p1.y;
    float dxl = p2.x - p1.x;
    float dyl = p2.y - p1.y;
    float cross = dxc*dyl - dyc*dxl;

    if (fabsf(cross) < (threshold*fmaxf(fabsf(dxl), fabsf(dyl))))
    {
        if (fabsf(dxl) >= fabsf(dyl)) collision = (dxl > 0)? ((p1.x <= point.x) && (point.x <= p2.x)) : ((p2.x <= point.x) && (point.x <= p1.x));
        else collision = (dyl > 0)? ((p1.y <= point.y) && (point.y <= p2.y)) : ((p2.y <= point.y) && (point.y <= p1.y));
    }
	
    return collision;
}